

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcCompositeCurve::IfcCompositeCurve(IfcCompositeCurve *this,void **vtt)

{
  void *pvVar1;
  _func_int **pp_Var2;
  
  IfcBoundedCurve::IfcBoundedCurve(&this->super_IfcBoundedCurve,vtt + 1);
  pvVar1 = vtt[0x17];
  *(void **)&(this->super_IfcBoundedCurve).super_IfcCurve.field_0x40 = pvVar1;
  *(void **)(&(this->super_IfcBoundedCurve).super_IfcCurve.field_0x40 +
            *(long *)((long)pvVar1 + -0x18)) = vtt[0x18];
  *(undefined8 *)&(this->super_IfcBoundedCurve).field_0x48 = 0;
  pp_Var2 = (_func_int **)*vtt;
  (this->super_IfcBoundedCurve).super_IfcCurve.super_IfcGeometricRepresentationItem.
  super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       pp_Var2;
  *(void **)((long)&(this->super_IfcBoundedCurve).super_IfcCurve.
                    super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
                    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                    _vptr_ObjectHelper + (long)pp_Var2[0xfffffffffffffffd]) = vtt[0x19];
  *(void **)&(this->super_IfcBoundedCurve).super_IfcCurve.super_IfcGeometricRepresentationItem.
             super_IfcRepresentationItem.
             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 =
       vtt[0x1a];
  *(void **)&(this->super_IfcBoundedCurve).super_IfcCurve.super_IfcGeometricRepresentationItem.
             super_IfcRepresentationItem.
             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 =
       vtt[0x1b];
  *(void **)&(this->super_IfcBoundedCurve).super_IfcCurve.super_IfcGeometricRepresentationItem.
             field_0x30 = vtt[0x1c];
  *(void **)&(this->super_IfcBoundedCurve).super_IfcCurve.field_0x40 = vtt[0x1d];
  *(undefined8 *)&(this->super_IfcBoundedCurve).field_0x50 = 0;
  *(undefined8 *)&this->field_0x58 = 0;
  *(undefined8 *)&this->field_0x60 = 0;
  (this->SelfIntersect).
  super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->SelfIntersect).
  super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  return;
}

Assistant:

IfcCompositeCurve() : Object("IfcCompositeCurve") {}